

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

double __thiscall llvm::FileError::log(FileError *this,double __x)

{
  raw_ostream *prVar1;
  size_t in_RCX;
  raw_ostream *in_RSI;
  double extraout_XMM0_Qa;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  
  if (((this->Err)._M_t.
       super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
       super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl != (ErrorInfoBase *)0x0) &&
     ((this->FileName)._M_string_length != 0)) {
    Str.Length = 1;
    Str.Data = "\'";
    prVar1 = raw_ostream::operator<<(in_RSI,Str);
    prVar1 = (raw_ostream *)
             raw_ostream::write(prVar1,(int)(this->FileName)._M_dataplus._M_p,
                                (void *)(this->FileName)._M_string_length,in_RCX);
    Str_00.Length = 3;
    Str_00.Data = "\': ";
    raw_ostream::operator<<(prVar1,Str_00);
    if ((this->Line).Storage.hasVal == true) {
      Str_01.Length = 5;
      Str_01.Data = "line ";
      prVar1 = raw_ostream::operator<<(in_RSI,Str_01);
      if ((this->Line).Storage.hasVal == false) {
        __assert_fail("hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                      ,0xb1,
                      "const T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() const & [T = unsigned long]"
                     );
      }
      prVar1 = raw_ostream::operator<<(prVar1,(this->Line).Storage.field_0.value);
      Str_02.Length = 2;
      Str_02.Data = ": ";
      raw_ostream::operator<<(prVar1,Str_02);
    }
    (*((this->Err)._M_t.
       super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
       super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl)->_vptr_ErrorInfoBase[2])();
    return extraout_XMM0_Qa;
  }
  __assert_fail("Err && !FileName.empty() && \"Trying to log after takeError().\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                ,0x4cc,"virtual void llvm::FileError::log(raw_ostream &) const");
}

Assistant:

void log(raw_ostream &OS) const override {
    assert(Err && !FileName.empty() && "Trying to log after takeError().");
    OS << "'" << FileName << "': ";
    if (Line.hasValue())
      OS << "line " << Line.getValue() << ": ";
    Err->log(OS);
  }